

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_parameter_map.cpp
# Opt level: O3

unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
 __thiscall
duckdb::BoundParameterMap::BindParameterExpression
          (BoundParameterMap *this,ParameterExpression *expr)

{
  bool bVar1;
  BoundParameterExpression *this_00;
  pointer pBVar2;
  BoundParameterData *pBVar3;
  long in_RDX;
  pointer *__ptr;
  shared_ptr<duckdb::BoundParameterData,_true> param_data;
  LogicalType identifier_type;
  LogicalType param_type;
  undefined1 local_a0 [40];
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  
  CreateOrGetData((BoundParameterMap *)local_a0,(string *)expr);
  this_00 = (BoundParameterExpression *)operator_new(0x88);
  BoundParameterExpression::BoundParameterExpression(this_00,(string *)(in_RDX + 0x38));
  *(BoundParameterExpression **)this = this_00;
  pBVar2 = unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
                         *)this);
  shared_ptr<duckdb::BoundParameterData,_true>::operator=
            (&pBVar2->parameter_data,(shared_ptr<duckdb::BoundParameterData,_true> *)local_a0);
  pBVar2 = unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
                         *)this);
  ::std::__cxx11::string::_M_assign
            ((string *)&(pBVar2->super_Expression).super_BaseExpression.alias);
  pBVar3 = shared_ptr<duckdb::BoundParameterData,_true>::operator->
                     ((shared_ptr<duckdb::BoundParameterData,_true> *)local_a0);
  LogicalType::LogicalType(&local_48,&pBVar3->return_type);
  GetReturnType(&local_78,(BoundParameterMap *)expr,(string *)(in_RDX + 0x38));
  LogicalType::LogicalType((LogicalType *)(local_a0 + 0x10),UNKNOWN);
  bVar1 = LogicalType::operator==(&local_78,(LogicalType *)(local_a0 + 0x10));
  if (bVar1) {
    LogicalType::LogicalType(&local_60,UNKNOWN);
    bVar1 = LogicalType::operator==(&local_48,&local_60);
    LogicalType::~LogicalType(&local_60);
    LogicalType::~LogicalType((LogicalType *)(local_a0 + 0x10));
    if (!bVar1) {
      *(undefined1 *)&(expr->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression = 1;
    }
  }
  else {
    LogicalType::~LogicalType((LogicalType *)(local_a0 + 0x10));
  }
  pBVar2 = unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
                         *)this);
  if (&(pBVar2->super_Expression).return_type != &local_78) {
    (pBVar2->super_Expression).return_type.id_ = local_78.id_;
    (pBVar2->super_Expression).return_type.physical_type_ = local_78.physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(pBVar2->super_Expression).return_type.type_info_,&local_78.type_info_);
  }
  LogicalType::~LogicalType(&local_78);
  LogicalType::~LogicalType(&local_48);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
  }
  return (unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>_>
          )(unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>_>
            )this;
}

Assistant:

unique_ptr<BoundParameterExpression> BoundParameterMap::BindParameterExpression(ParameterExpression &expr) {

	auto &identifier = expr.identifier;
	D_ASSERT(!parameter_data.count(identifier));

	// No value has been supplied yet,
	// We return a shared pointer to an object that will get populated with a Value later
	// When the BoundParameterExpression gets executed, this will be used to get the corresponding value
	auto param_data = CreateOrGetData(identifier);
	auto bound_expr = make_uniq<BoundParameterExpression>(identifier);

	bound_expr->parameter_data = param_data;
	bound_expr->SetAlias(expr.GetAlias());

	auto param_type = param_data->return_type;
	auto identifier_type = GetReturnType(identifier);

	// we found a type for this bound parameter, but now we found another occurrence with the same identifier,
	// a CAST around this consecutive occurrence might swallow the unknown type of this consecutive occurrence,
	// then, if we do not rebind, we potentially have unknown data types during execution
	if (identifier_type == LogicalType::UNKNOWN && param_type != LogicalType::UNKNOWN) {
		rebind = true;
	}

	bound_expr->return_type = identifier_type;
	return bound_expr;
}